

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streaminfo.c
# Opt level: O3

void mpt_stream_setnewline(mpt_streaminfo *info,int nl,int what)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = nl & 3;
  if ((what & 3U) == 1) {
    uVar1 = info->_fd;
  }
  else {
    if ((what & 3U) == 0) {
      uVar2 = uVar2 << 0xc;
      uVar1 = info->_fd & 0xffffffffffffcfff;
      goto LAB_00108a6d;
    }
    uVar1 = info->_fd & 0xffffffffffffcfff | (ulong)(uVar2 << 0xc);
  }
  uVar2 = uVar2 << 0xe;
  uVar1 = uVar1 & 0xffffffffffff3fff;
LAB_00108a6d:
  info->_fd = uVar1 | uVar2;
  return;
}

Assistant:

extern void mpt_stream_setnewline(MPT_STRUCT(streaminfo) *info, int nl, int what)
{
	switch (what & 0x3) {
	  case MPT_STREAMFLAG(Read):  what = 0x1; break;
	  case MPT_STREAMFLAG(Write): what = 0x2; break;
	  default:                    what = 0x3;
	}
	nl &= 0x3;
	if (what & 0x1) {
		info->_fd = (nl << 12) | (info->_fd & ~(0x3 << 12));
	}
	if (what & 0x2) {
		info->_fd = (nl << 14) | (info->_fd & ~(0x3 << 14));
	}
}